

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

JSONNode __thiscall JSONNode::pop_back(JSONNode *this,json_index_t pos)

{
  size_t *psVar1;
  json_index_t jVar2;
  internalJSONNode *piVar3;
  JSONNode *ptr;
  out_of_range *this_00;
  string *psVar4;
  uint in_EDX;
  undefined4 in_register_00000034;
  undefined8 *puVar5;
  
  puVar5 = (undefined8 *)CONCAT44(in_register_00000034,pos);
  piVar3 = (internalJSONNode *)*puVar5;
  jVar2 = 0;
  if (0xfd < (byte)(piVar3->_type - 6)) {
    internalJSONNode::Fetch(piVar3);
    jVar2 = piVar3->Children->mysize;
  }
  if (in_EDX < jVar2) {
    piVar3 = (internalJSONNode *)*puVar5;
    if (1 < piVar3->refcount) {
      piVar3->refcount = piVar3->refcount - 1;
      piVar3 = internalJSONNode::newInternal(piVar3);
    }
    *puVar5 = piVar3;
    ptr = internalJSONNode::pop_back(piVar3,in_EDX);
    piVar3 = ptr->internal;
    psVar1 = &piVar3->refcount;
    *psVar1 = *psVar1 + 1;
    this->internal = piVar3;
    deleteJSONNode(ptr);
    return (JSONNode)(internalJSONNode *)this;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar4 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar4);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    if (json_unlikely(pos >= internal -> size())){
	   JSON_FAIL(JSON_TEXT("pop_back out of bounds"));
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    }
    makeUniqueInternal();
    #ifdef JSON_LIBRARY
	   return internal -> pop_back(pos);
    #else
	   auto_delete temp(internal -> pop_back(pos));
	   return *temp.mynode;
    #endif
}